

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merlin.cpp
# Opt level: O0

bool __thiscall Merlin::read_virtual_evidence(Merlin *this,char *filename)

{
  byte bVar1;
  runtime_error *this_00;
  void *this_01;
  reference pvVar2;
  mapped_type *this_02;
  runtime_error *e;
  size_t k;
  likelihood l;
  size_t dom;
  vindex var;
  int local_260;
  int i;
  int num_evid;
  string err_msg;
  undefined1 local_228 [8];
  ifstream in;
  char *filename_local;
  Merlin *this_local;
  
  std::ifstream::ifstream(local_228,filename,_S_in);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::
    map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
    ::clear(&this->m_virtualEvidence);
    std::istream::operator>>(local_228,&local_260);
    for (var._4_4_ = 0; var._4_4_ < local_260; var._4_4_ = var._4_4_ + 1) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&k);
      this_01 = (void *)std::istream::operator>>(local_228,&dom);
      std::istream::operator>>
                (this_01,(ulong *)&l.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)&k,
                 (size_type)
                 l.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      for (e = (runtime_error *)0x0;
          e < l.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage; e = e + 1) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&k,(size_type)e);
        std::istream::operator>>(local_228,pvVar2);
      }
      this_02 = std::
                map<unsigned_long,_std::vector<double,_std::allocator<double>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<double,_std::allocator<double>_>_>_>_>
                ::operator[](&this->m_virtualEvidence,&dom);
      std::vector<double,_std::allocator<double>_>::operator=
                (this_02,(vector<double,_std::allocator<double>_> *)&k);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&k);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_228);
    return true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&num_evid,"Cannot open the virtual evidence file: ",
             (allocator *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::__cxx11::string::operator+=((string *)&num_evid,filename);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&num_evid);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Merlin::read_virtual_evidence(const char* filename) {
	try {

		// Open the evidence file
		std::ifstream in(filename);
		if (in.fail()) {
			std::string err_msg("Cannot open the virtual evidence file: ");
			err_msg += filename;
			throw std::runtime_error(err_msg);
		}

		// Clear any previous virtual evidence
		m_virtualEvidence.clear();

		// Read the virtual evidence file
		int num_evid;
		in >> num_evid;
		for (int i = 0; i < num_evid; ++i) {
			vindex var;
			size_t dom;
			likelihood l;
			in >> var >> dom;
			l.resize(dom);
			for (size_t k = 0; k < dom; ++k) {
				in >> l[k];
			}

			m_virtualEvidence[var] = l;
		}

		// Close the evidence file
		in.close();

		return true;
	} catch (const std::runtime_error& e) {
		std::cerr << e.what() << std::endl;
		return false;
	}
}